

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_cpio_svr4_gzip.c
# Opt level: O0

void test_read_format_cpio_svr4_gzip(void)

{
  int iVar1;
  archive *a_00;
  void *in_stack_00000010;
  int r;
  archive *a;
  archive_entry *ae;
  archive *in_stack_ffffffffffffffd8;
  archive *a_01;
  void *buff;
  archive_entry **entry;
  int n;
  archive *in_stack_ffffffffffffffe0;
  wchar_t in_stack_ffffffffffffffe8;
  wchar_t in_stack_ffffffffffffffec;
  wchar_t wVar2;
  archive_entry *in_stack_fffffffffffffff8;
  
  a_00 = archive_read_new();
  assertion_assert((char *)a_00,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
                   (char *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  archive_read_support_filter_all(in_stack_ffffffffffffffd8);
  a_01 = (archive *)0x0;
  assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)a_00 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)in_stack_ffffffffffffffe0,0,(char *)0x1778df,in_stack_00000010);
  iVar1 = archive_read_support_filter_gzip
                    ((archive *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  if (iVar1 == -0x14) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_svr4_gzip.c"
                   ,L'-');
    wVar2 = (wchar_t)((ulong)a_00 >> 0x20);
    test_skipping("gzip reading not fully supported on this platform");
    archive_read_free((archive *)0x17791d);
    assertion_equal_int((char *)in_stack_fffffffffffffff8,wVar2,
                        CONCAT44(iVar1,in_stack_ffffffffffffffe8),(char *)in_stack_ffffffffffffffe0,
                        0,(char *)0x17794b,in_stack_00000010);
  }
  else {
    archive_read_support_format_all(a_01);
    buff = (void *)0x0;
    assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)a_00 >> 0x20),
                        CONCAT44(iVar1,in_stack_ffffffffffffffe8),(char *)in_stack_ffffffffffffffe0,
                        0,(char *)0x177988,in_stack_00000010);
    archive_read_open_memory(in_stack_ffffffffffffffe0,buff,0x17799e);
    entry = (archive_entry **)0x0;
    assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)a_00 >> 0x20),
                        CONCAT44(iVar1,in_stack_ffffffffffffffe8),(char *)in_stack_ffffffffffffffe0,
                        0,(char *)0x1779cc,in_stack_00000010);
    archive_read_next_header(in_stack_ffffffffffffffe0,entry);
    n = 0;
    assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)a_00 >> 0x20),
                        CONCAT44(iVar1,in_stack_ffffffffffffffe8),(char *)in_stack_ffffffffffffffe0,
                        0,(char *)0x177a09,in_stack_00000010);
    archive_filter_code(in_stack_ffffffffffffffe0,n);
    assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)a_00 >> 0x20),
                        CONCAT44(iVar1,in_stack_ffffffffffffffe8),(char *)in_stack_ffffffffffffffe0,
                        0,(char *)0x177a47,in_stack_00000010);
    archive_format(a_00);
    assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)a_00 >> 0x20),
                        CONCAT44(iVar1,in_stack_ffffffffffffffe8),(char *)in_stack_ffffffffffffffe0,
                        0,(char *)0x177a83,in_stack_00000010);
    archive_entry_is_encrypted(in_stack_fffffffffffffff8);
    assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)a_00 >> 0x20),
                        CONCAT44(iVar1,in_stack_ffffffffffffffe8),(char *)in_stack_ffffffffffffffe0,
                        0,(char *)0x177abc,in_stack_00000010);
    archive_read_has_encrypted_entries((archive *)CONCAT44(iVar1,in_stack_ffffffffffffffe8));
    assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)a_00 >> 0x20),
                        CONCAT44(iVar1,in_stack_ffffffffffffffe8),(char *)in_stack_ffffffffffffffe0,
                        (longlong)a_00,(char *)0x177af8,in_stack_00000010);
    wVar2 = (wchar_t)((ulong)a_00 >> 0x20);
    archive_read_close((archive *)0x177b02);
    assertion_equal_int((char *)in_stack_fffffffffffffff8,wVar2,
                        CONCAT44(iVar1,in_stack_ffffffffffffffe8),(char *)in_stack_ffffffffffffffe0,
                        0,(char *)0x177b30,in_stack_00000010);
    archive_read_free((archive *)0x177b3a);
    assertion_equal_int((char *)in_stack_fffffffffffffff8,wVar2,
                        CONCAT44(iVar1,in_stack_ffffffffffffffe8),(char *)in_stack_ffffffffffffffe0,
                        0,(char *)0x177b68,in_stack_00000010);
  }
  return;
}

Assistant:

DEFINE_TEST(test_read_format_cpio_svr4_gzip)
{
	struct archive_entry *ae;
	struct archive *a;
	int r;

	assert((a = archive_read_new()) != NULL);
	assertEqualInt(ARCHIVE_OK, archive_read_support_filter_all(a));
	r = archive_read_support_filter_gzip(a);
	if (r == ARCHIVE_WARN) {
		skipping("gzip reading not fully supported on this platform");
		assertEqualInt(ARCHIVE_OK, archive_read_free(a));
		return;
	}
	assertEqualInt(ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualInt(ARCHIVE_OK,
	    archive_read_open_memory(a, archive, sizeof(archive)));
	assertEqualInt(ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(archive_filter_code(a, 0),
	    ARCHIVE_FILTER_GZIP);
	assertEqualInt(archive_format(a),
	    ARCHIVE_FORMAT_CPIO_SVR4_NOCRC);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}